

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O1

ssize_t __thiscall bitio::stream::read(stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint64_t uVar6;
  byte bVar7;
  ulong uVar8;
  
  if (__fd == 0) {
    uVar8 = 0;
  }
  else {
    bVar2 = (byte)__fd;
    bVar7 = bVar2 & 7;
    if (this->_bit_head == '\b') {
      this->_bit_head = '\0';
      uVar6 = this->_byte_head + 1;
    }
    else {
      uVar6 = this->_byte_head;
    }
    bVar1 = read_byte(this,uVar6,true);
    bVar3 = 8 - this->_bit_head;
    bVar5 = bVar7 - bVar3;
    if (bVar7 < bVar3 || bVar5 == 0) {
      bVar4 = bVar3 - bVar7;
      bVar3 = ((&u8_rmasks)[bVar3] & bVar1) >> (bVar4 & 0x1f);
      this->_bit_head = this->_bit_head + bVar7;
      bVar5 = 0;
    }
    else {
      bVar3 = (&u8_rmasks)[bVar3] & bVar1;
      this->_bit_head = '\b';
      bVar4 = 0;
    }
    uVar8 = (ulong)bVar3;
    bVar7 = bVar2 >> 3;
    if (bVar2 < 8) goto LAB_0010267a;
    if (bVar4 == 0) goto LAB_0010267a;
    bVar5 = 8 - bVar4;
    uVar8 = (uVar8 << (bVar4 & 0x3f)) + (ulong)(bVar1 & (&u8_rmasks)[bVar4]);
    while( true ) {
      bVar7 = bVar7 - 1;
      this->_bit_head = '\b';
LAB_0010267a:
      if (bVar7 == 0) break;
      if (this->_bit_head == '\b') {
        this->_bit_head = '\0';
        uVar6 = this->_byte_head + 1;
      }
      else {
        uVar6 = this->_byte_head;
      }
      bVar2 = read_byte(this,uVar6,true);
      uVar8 = uVar8 << 8 | (ulong)bVar2;
    }
    if (bVar5 != 0) {
      if (this->_bit_head == '\b') {
        this->_bit_head = '\0';
        uVar6 = this->_byte_head + 1;
      }
      else {
        uVar6 = this->_byte_head;
      }
      bVar7 = read_byte(this,uVar6,true);
      uVar8 = (uVar8 << (bVar5 & 0x3f)) + (ulong)(bVar7 >> (8 - bVar5 & 0x1f));
      this->_bit_head = this->_bit_head + bVar5;
    }
  }
  return uVar8;
}

Assistant:

uint64_t bitio::stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    uint8_t nbytes = n >> 3;
    uint8_t nbits = n & 0x7;

    // First, read the leftover bits.
    uint8_t curr_byte = read_next_byte();

    uint8_t rbits = 8 - _bit_head;

    if (nbits <= rbits) {
        value = (curr_byte & u8_rmasks[rbits]) >> (rbits - nbits);
        _bit_head += nbits;
        rbits -= nbits;
        nbits = 0;
    } else {
        value = curr_byte & u8_rmasks[rbits];
        nbits -= rbits;
        rbits = 0;
        _bit_head = 8;
    }

    // Now, if we need to read some nbytes and we have leftover rbits, we borrow a byte from the stream and
    // add the carry to nbits.

    if (rbits != 0) {
        if (nbytes != 0) {
            nbytes--;
            nbits = 8 - rbits;
            value <<= rbits;
            value += curr_byte & u8_rmasks[rbits];
            _bit_head = 8;
        }
    }

    // Now, read the nbytes.
    while (nbytes--) {
        value <<= 0x8;
        value += read_next_byte();
        _bit_head = 8;
    }

    // Read the remaining nbits. We don't need masks here because, bit_head is always 8 if nbits != 0
    if (nbits != 0) {
        curr_byte = read_next_byte();
        value <<= nbits;
        value += (curr_byte >> (8 - nbits));
        _bit_head += nbits;
    }

    return value;
}